

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

vector_t * load_config(vector_t *__return_storage_ptr__,QString *file_name)

{
  char cVar1;
  file_format_t fVar2;
  exception_t<cfgfile::qstring_trait_t> *this;
  int column;
  int line;
  QDomDocument doc;
  QFile file;
  QArrayDataPointer<char16_t> local_310;
  QTextStream stream;
  string_t local_2e8;
  QString data;
  Data *local_2b8;
  char16_t *local_2b0;
  qsizetype qStack_2a8;
  _Head_base<0UL,_cfgfile::details::parser_base_t<cfgfile::qstring_trait_t>_*,_false> local_2a0;
  char16_t *local_298;
  qsizetype qStack_290;
  undefined1 local_288 [24];
  undefined1 local_270 [24];
  QString local_258;
  undefined1 local_240 [24];
  undefined1 local_228 [24];
  undefined1 local_210 [24];
  determine_format_t<cfgfile::qstring_trait_t> d;
  tag_vector_t<cfgfile::qstring_trait_t> read_tag;
  
  cfg::tag_vector_t<cfgfile::qstring_trait_t>::tag_vector_t(&read_tag);
  QFile::QFile(&file,(QString *)file_name);
  cVar1 = QFile::open(&file,1);
  if (cVar1 == '\0') {
    (__return_storage_ptr__->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    QTextStream::QTextStream(&stream,(QIODevice *)&file);
    local_310.d = (file_name->d).d;
    local_310.ptr = (file_name->d).ptr;
    local_310.size = (file_name->d).size;
    if (local_310.d != (Data *)0x0) {
      LOCK();
      ((local_310.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_310.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    d.m_stream = &stream;
    fVar2 = cfgfile::details::determine_format_t<cfgfile::qstring_trait_t>::format(&d);
    cfgfile::qstring_trait_t::to_begin(&stream);
    if (fVar2 == xml_format) {
      QDomDocument::QDomDocument(&doc);
      line = 0;
      d.m_stream = (istream_t *)0x0;
      QTextStream::readAll();
      cVar1 = QDomDocument::setContent
                        ((QString *)&doc,SUB81(&data,0),(QString *)0x1,(int *)&d,&line);
      if (cVar1 == '\0') {
        this = (exception_t<cfgfile::qstring_trait_t> *)__cxa_allocate_exception(0x28);
        QString::QString(&local_258,
                         "Unable to parse XML from file: \"%1\". \"%2\" On line %3, column %4.");
        local_2b8 = local_310.d;
        local_2b0 = local_310.ptr;
        qStack_2a8 = local_310.size;
        if (local_310.d != (Data *)0x0) {
          LOCK();
          ((local_310.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_310.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        QString::arg((QString *)local_240,(int)&local_258,(QChar)(char16_t)&local_2b8);
        QString::arg((QString *)local_228,(int)local_240,(QChar)(char16_t)&d);
        QString::number((int)local_270,line);
        QString::arg((QString *)local_210,(int)local_228,(QChar)(char16_t)local_270);
        QString::number((int)local_288,0);
        QString::arg((QString *)&local_2a0,(int)local_210,(QChar)(char16_t)local_288);
        local_2e8.m_str.d.d = (Data *)local_2a0._M_head_impl;
        local_2e8.m_str.d.ptr = local_298;
        local_2e8.m_str.d.size = qStack_290;
        if (local_2a0._M_head_impl != (parser_base_t<cfgfile::qstring_trait_t> *)0x0) {
          LOCK();
          (((QArrayData *)&(local_2a0._M_head_impl)->_vptr_parser_base_t)->ref_)._q_value.
          super___atomic_base<int>._M_i =
               (((QArrayData *)&(local_2a0._M_head_impl)->_vptr_parser_base_t)->ref_)._q_value.
               super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        cfgfile::exception_t<cfgfile::qstring_trait_t>::exception_t(this,&local_2e8);
        __cxa_throw(this,&cfgfile::exception_t<cfgfile::qstring_trait_t>::typeinfo,
                    cfgfile::exception_t<cfgfile::qstring_trait_t>::~exception_t);
      }
      cfgfile::parser_t<cfgfile::qstring_trait_t>::parser_t
                ((parser_t<cfgfile::qstring_trait_t> *)&local_2e8,
                 (tag_t<cfgfile::qstring_trait_t> *)&read_tag,&doc);
      (**(code **)(*(long *)&(local_2e8.m_str.d.d)->super_QArrayData + 0x10))
                (local_2e8.m_str.d.d,&local_310);
      if (local_2e8.m_str.d.d != (Data *)0x0) {
        (**(code **)(*(long *)&(local_2e8.m_str.d.d)->super_QArrayData + 8))();
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&data.d);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&d);
      QDomDocument::~QDomDocument(&doc);
    }
    else if (fVar2 == cfgfile_format) {
      cfgfile::input_stream_t<cfgfile::qstring_trait_t>::input_stream_t
                ((input_stream_t<cfgfile::qstring_trait_t> *)&d,(string_t *)&local_310,&stream);
      cfgfile::parser_t<cfgfile::qstring_trait_t>::parser_t
                ((parser_t<cfgfile::qstring_trait_t> *)&data,
                 (tag_t<cfgfile::qstring_trait_t> *)&read_tag,
                 (input_stream_t<cfgfile::qstring_trait_t> *)&d);
      (**(code **)(*(long *)&(data.d.d)->super_QArrayData + 0x10))(data.d.d,&local_310);
      if (data.d.d != (Data *)0x0) {
        (**(code **)(*(long *)&(data.d.d)->super_QArrayData + 8))();
      }
      cfgfile::input_stream_t<cfgfile::qstring_trait_t>::~input_stream_t
                ((input_stream_t<cfgfile::qstring_trait_t> *)&d);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_310);
    QFileDevice::close();
    cfg::tag_vector_t<cfgfile::qstring_trait_t>::get_cfg(__return_storage_ptr__,&read_tag);
    QTextStream::~QTextStream(&stream);
  }
  QFile::~QFile(&file);
  cfg::tag_vector_t<cfgfile::qstring_trait_t>::~tag_vector_t(&read_tag);
  return __return_storage_ptr__;
}

Assistant:

cfg::vector_t load_config( const QString & file_name )
{
	cfg::tag_vector_t< cfgfile::qstring_trait_t > read_tag;

	QFile file( file_name );

	if( !file.open( QIODevice::ReadOnly ) )
		return cfg::vector_t();

	QTextStream stream( &file );

	try {
		cfgfile::read_cfgfile(
			read_tag, stream, file_name );

		file.close();
	}
	catch( const cfgfile::exception_t< cfgfile::qstring_trait_t > & )
	{
		file.close();

		throw;
	}

	return read_tag.get_cfg();
}